

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
copy_str<char16_t,char16_t_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
          (char16_t *begin,char16_t *end,
          back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out)

{
  char16_t cVar1;
  size_t sVar2;
  
  if (begin != end) {
    do {
      cVar1 = *begin;
      if ((out.container)->capacity_ < (out.container)->size_ + 1) {
        (**(out.container)->_vptr_buffer)(out.container);
      }
      begin = begin + 1;
      sVar2 = (out.container)->size_;
      (out.container)->size_ = sVar2 + 1;
      (out.container)->ptr_[sVar2] = cVar1;
    } while (begin != end);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out.container;
}

Assistant:

FMT_CONSTEXPR auto copy_str(InputIt begin, InputIt end, OutputIt out)
    -> OutputIt {
  while (begin != end) *out++ = static_cast<Char>(*begin++);
  return out;
}